

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O2

int mg_session_write_integer(mg_session *session,int64_t value)

{
  int iVar1;
  
  if (0x8f < value + 0x10U) {
    if ((char)(uint8_t)value == value) {
      iVar1 = mg_session_write_uint8(session,200);
      if (iVar1 == 0) goto LAB_00107c6e;
    }
    else if ((short)(uint16_t)value == value) {
      iVar1 = mg_session_write_uint8(session,0xc9);
      if (iVar1 == 0) {
        iVar1 = mg_session_write_uint16(session,(uint16_t)value);
        return iVar1;
      }
    }
    else if ((int)(uint32_t)value == value) {
      iVar1 = mg_session_write_uint8(session,0xca);
      if (iVar1 == 0) {
        iVar1 = mg_session_write_uint32(session,(uint32_t)value);
        return iVar1;
      }
    }
    else {
      iVar1 = mg_session_write_uint8(session,0xcb);
      if (iVar1 == 0) {
        iVar1 = mg_session_write_uint64(session,value);
        return iVar1;
      }
    }
    return iVar1;
  }
LAB_00107c6e:
  iVar1 = mg_session_write_uint8(session,(uint8_t)value);
  return iVar1;
}

Assistant:

int mg_session_write_integer(mg_session *session, int64_t value) {
  if (value >= MG_TINY_INT_MIN && value <= MG_TINY_INT_MAX) {
    return mg_session_write_uint8(session, (uint8_t)value);
  }
  if (value >= INT8_MIN && value <= INT8_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_8));
    return mg_session_write_uint8(session, (uint8_t)value);
  }
  if (value >= INT16_MIN && value <= INT16_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_16));
    return mg_session_write_uint16(session, (uint16_t)value);
  }
  if (value >= INT32_MIN && value <= INT32_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_32));
    return mg_session_write_uint32(session, (uint32_t)value);
  }
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_64));
  return mg_session_write_uint64(session, (uint64_t)value);
}